

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

bool QtPrivate::
     sequential_erase_one<QList<QFontDatabase::WritingSystem>,QFontDatabase::WritingSystem>
               (QList<QFontDatabase::WritingSystem> *c,WritingSystem *t)

{
  WritingSystem *pWVar1;
  WritingSystem *pWVar2;
  const_iterator abegin;
  
  pWVar2 = (c->d).ptr;
  pWVar1 = pWVar2 + (c->d).size;
  abegin = std::
           __find_if<QList<QFontDatabase::WritingSystem>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<QFontDatabase::WritingSystem_const>>
                     (pWVar2,pWVar1,t);
  if (abegin.i != pWVar1) {
    QList<QFontDatabase::WritingSystem>::erase(c,abegin,(const_iterator)(abegin.i + 1));
  }
  return abegin.i != pWVar1;
}

Assistant:

auto sequential_erase_one(Container &c, const T &t)
{
    const auto cend = c.cend();
    const auto it = std::find(c.cbegin(), cend, t);
    if (it == cend)
        return false;
    c.erase(it);
    return true;
}